

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::setup
          (TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest *this)

{
  MemoryLeakFailureForTest *this_00;
  MemoryLeakDetector *this_01;
  AllocatorForMemoryLeakDetectionTest *this_02;
  SimpleString *this_03;
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest *this_local;
  
  this_00 = (MemoryLeakFailureForTest *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x74);
  MemoryLeakFailureForTest::MemoryLeakFailureForTest(this_00);
  this->reporter = this_00;
  this_01 = (MemoryLeakDetector *)
            operator_new(0x1298,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x75);
  MemoryLeakDetector::MemoryLeakDetector(this_01,&this->reporter->super_MemoryLeakFailure);
  this->detector = this_01;
  this_02 = (AllocatorForMemoryLeakDetectionTest *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x76);
  AllocatorForMemoryLeakDetectionTest::AllocatorForMemoryLeakDetectionTest(this_02);
  this->testAllocator = this_02;
  MemoryLeakDetector::enable(this->detector);
  MemoryLeakDetector::startChecking(this->detector);
  this_03 = (SimpleString *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x79);
  SimpleString::SimpleString(this_03,"");
  this->reporter->message = this_03;
  return;
}

Assistant:

void setup() _override
    {
        reporter = new MemoryLeakFailureForTest;
        detector = new MemoryLeakDetector(reporter);
        testAllocator = new AllocatorForMemoryLeakDetectionTest;
        detector->enable();
        detector->startChecking();
        reporter->message = new SimpleString();
    }